

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
__thiscall
duckdb::ListColumnData::Checkpoint
          (ListColumnData *this,RowGroup *row_group,ColumnCheckpointInfo *checkpoint_info)

{
  _func_int **pp_Var1;
  RowGroup *pRVar2;
  RowGroup *pRVar3;
  _func_int **pp_Var4;
  pointer pCVar5;
  pointer pCVar6;
  pointer *__ptr;
  RowGroup *local_30;
  _func_int **local_28;
  
  ColumnData::Checkpoint(&this->super_ColumnData,row_group,checkpoint_info);
  ColumnData::Checkpoint
            ((ColumnData *)&stack0xffffffffffffffd8,
             (RowGroup *)
             &row_group[1].columns.
              super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
              .
              super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,checkpoint_info);
  pCVar5 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     ((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>
                       *)&row_group[1].columns.
                          super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                          .
                          super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  (*pCVar5->_vptr_ColumnData[0x1c])(&local_30,pCVar5,checkpoint_info);
  pCVar6 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
           ::operator->((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                         *)this);
  pp_Var4 = local_28;
  local_28 = (_func_int **)0x0;
  pp_Var1 = pCVar6[1]._vptr_ColumnCheckpointState;
  pCVar6[1]._vptr_ColumnCheckpointState = pp_Var4;
  if (pp_Var1 != (_func_int **)0x0) {
    (**(code **)(*pp_Var1 + 8))();
  }
  pRVar3 = local_30;
  local_30 = (RowGroup *)0x0;
  pRVar2 = pCVar6[1].row_group;
  pCVar6[1].row_group = pRVar3;
  if (pRVar2 != (RowGroup *)0x0) {
    (**(code **)((pRVar2->super_SegmentBase<duckdb::RowGroup>).start + 8))();
    if (local_30 != (RowGroup *)0x0) {
      (**(code **)((local_30->super_SegmentBase<duckdb::RowGroup>).start + 8))();
    }
  }
  if (local_28 != (_func_int **)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  return (unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
          )(unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
            )this;
}

Assistant:

unique_ptr<ColumnCheckpointState> ListColumnData::Checkpoint(RowGroup &row_group,
                                                             ColumnCheckpointInfo &checkpoint_info) {
	auto base_state = ColumnData::Checkpoint(row_group, checkpoint_info);
	auto validity_state = validity.Checkpoint(row_group, checkpoint_info);
	auto child_state = child_column->Checkpoint(row_group, checkpoint_info);

	auto &checkpoint_state = base_state->Cast<ListColumnCheckpointState>();
	checkpoint_state.validity_state = std::move(validity_state);
	checkpoint_state.child_state = std::move(child_state);
	return base_state;
}